

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_type_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  int iVar3;
  coda_type_text *pcVar4;
  char *__s1;
  char **ppcVar5;
  
  __s1 = *attr;
  if (__s1 != (char *)0x0) {
    ppcVar5 = attr + 2;
    do {
      iVar2 = strcmp(__s1,"name");
      if (iVar2 == 0) {
        if (ppcVar5[-1] != (char *)0x0) {
          coda_set_error(-400,"attribute \'name\' not allowed for Type");
          return -1;
        }
        break;
      }
      __s1 = *ppcVar5;
      ppcVar5 = ppcVar5 + 2;
    } while (__s1 != (char *)0x0);
  }
  iVar3 = handle_format_attribute_for_type(info,attr);
  iVar2 = -1;
  if (iVar3 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    pcVar4 = coda_type_text_new(pnVar1->format);
    pnVar1 = info->node;
    pnVar1->data = pcVar4;
    if (pcVar4 != (coda_type_text *)0x0) {
      register_type_elements(pnVar1,cd_type_set_type);
      pnVar1 = info->node;
      pnVar1->init_sub_element[0xb] = string_data_init;
      pnVar1->add_element_to_parent[0xb] = type_set_description;
      pnVar1 = info->node;
      pnVar1->init_sub_element[4] = cd_attribute_init;
      pnVar1->add_element_to_parent[4] = type_add_attribute;
      iVar2 = handle_xml_name((parser_info *)info->node,attr);
      iVar2 = -(uint)(iVar2 != 0);
    }
  }
  return iVar2;
}

Assistant:

static int cd_type_init(parser_info *info, const char **attr)
{
    if (get_attribute_value(attr, "name") != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'name' not allowed for Type");
        return -1;
    }
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    /* create dummy type where a description and attributes can be stored */
    info->node->data = coda_type_text_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    register_type_elements(info->node, cd_type_set_type);
    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);

    if (handle_xml_name(info, attr) != 0)
    {
        return -1;
    }

    return 0;
}